

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkEnum
          (DescriptorBuilder *this,EnumDescriptor *enum_type,EnumDescriptorProto *proto)

{
  long lVar1;
  EnumOptions *pEVar2;
  EnumValueOptions *pEVar3;
  long lVar4;
  long lVar5;
  
  if (*(long *)(enum_type + 0x20) == 0) {
    pEVar2 = EnumOptions::default_instance();
    *(EnumOptions **)(enum_type + 0x20) = pEVar2;
  }
  if (0 < *(int *)(enum_type + 0x2c)) {
    lVar4 = 0x20;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(enum_type + 0x30);
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                (&(proto->value_).super_RepeatedPtrFieldBase,(int)lVar5);
      if (*(long *)(lVar1 + lVar4) == 0) {
        pEVar3 = EnumValueOptions::default_instance();
        *(EnumValueOptions **)(lVar1 + lVar4) = pEVar3;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar5 < *(int *)(enum_type + 0x2c));
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkEnum(
    EnumDescriptor* enum_type, const EnumDescriptorProto& proto) {
  if (enum_type->options_ == NULL) {
    enum_type->options_ = &EnumOptions::default_instance();
  }

  for (int i = 0; i < enum_type->value_count(); i++) {
    CrossLinkEnumValue(&enum_type->values_[i], proto.value(i));
  }
}